

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

double evaluate_CAI_N(string *rna,vector<int,_std::allocator<int>_> *protein,int type)

{
  vector<int,_std::allocator<int>_> seq;
  allocator_type local_59;
  double local_58;
  _Vector_base<int,_std::allocator<int>_> local_50;
  string local_38;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_50,(long)(int)rna->_M_string_length,
             &local_59);
  std::__cxx11::string::string((string *)&local_38,(string *)rna);
  transform2num((vector<int,_std::allocator<int>_> *)&local_50,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (type == 1) {
    local_58 = getCAI_s((vector<int,_std::allocator<int>_> *)&local_50,protein);
  }
  else {
    local_58 = stand_getCAI_s((vector<int,_std::allocator<int>_> *)&local_50,protein);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_50);
  return local_58;
}

Assistant:

double evaluate_CAI_N(string & rna,vector<int> & protein,int type) {
    int l = int(rna.size());
    vector<int> seq(l);
    transform2num(seq,rna);
    double CAI;
    if (type == 1) CAI = getCAI_s(seq, protein);
    else CAI = stand_getCAI_s(seq, protein);
    return CAI;
}